

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::InitExtensions
          (LocalSingleBlockLoadStoreElimPass *this)

{
  long lVar1;
  allocator<char> local_816;
  allocator<char> local_815;
  allocator<char> local_814;
  allocator<char> local_813;
  allocator<char> local_812;
  allocator<char> local_811;
  allocator<char> local_810;
  allocator<char> local_80f;
  allocator<char> local_80e;
  allocator<char> local_80d;
  allocator<char> local_80c;
  allocator<char> local_80b;
  allocator<char> local_80a;
  allocator<char> local_809;
  allocator<char> local_808;
  allocator<char> local_807;
  allocator<char> local_806;
  allocator<char> local_805;
  allocator<char> local_804;
  allocator<char> local_803;
  allocator<char> local_802;
  allocator<char> local_801;
  allocator<char> local_800;
  allocator<char> local_7ff;
  allocator<char> local_7fe;
  allocator<char> local_7fd;
  allocator<char> local_7fc;
  allocator<char> local_7fb;
  allocator<char> local_7fa;
  allocator<char> local_7f9;
  allocator<char> local_7f8;
  allocator<char> local_7f7;
  allocator<char> local_7f6;
  allocator<char> local_7f5;
  allocator<char> local_7f4;
  allocator<char> local_7f3;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  allocator<char> local_7f0;
  allocator<char> local_7ef;
  allocator<char> local_7ee;
  allocator<char> local_7ed;
  allocator<char> local_7ec;
  allocator<char> local_7eb;
  allocator<char> local_7ea;
  allocator<char> local_7e9;
  allocator<char> local_7e8;
  allocator<char> local_7e7;
  allocator<char> local_7e6;
  allocator<char> local_7e5;
  allocator<char> local_7e4;
  allocator<char> local_7e3;
  allocator<char> local_7e2;
  allocator<char> local_7e1;
  allocator<char> local_7e0;
  allocator<char> local_7df;
  allocator<char> local_7de;
  allocator<char> local_7dd;
  allocator<char> local_7dc;
  allocator<char> local_7db;
  allocator<char> local_7da;
  allocator<char> local_7d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->extensions_allowlist_)._M_h);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"SPV_AMD_shader_explicit_vertex_parameter",&local_7d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b8,"SPV_AMD_shader_trinary_minmax",&local_7da);
  std::__cxx11::string::string<std::allocator<char>>(local_798,"SPV_AMD_gcn_shader",&local_7db);
  std::__cxx11::string::string<std::allocator<char>>(local_778,"SPV_KHR_shader_ballot",&local_7dc);
  std::__cxx11::string::string<std::allocator<char>>(local_758,"SPV_AMD_shader_ballot",&local_7dd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_738,"SPV_AMD_gpu_shader_half_float",&local_7de);
  std::__cxx11::string::string<std::allocator<char>>
            (local_718,"SPV_KHR_shader_draw_parameters",&local_7df);
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"SPV_KHR_subgroup_vote",&local_7e0);
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"SPV_KHR_8bit_storage",&local_7e1);
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"SPV_KHR_16bit_storage",&local_7e2);
  std::__cxx11::string::string<std::allocator<char>>(local_698,"SPV_KHR_device_group",&local_7e3);
  std::__cxx11::string::string<std::allocator<char>>(local_678,"SPV_KHR_multiview",&local_7e4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"SPV_NVX_multiview_per_view_attributes",&local_7e5);
  std::__cxx11::string::string<std::allocator<char>>(local_638,"SPV_NV_viewport_array2",&local_7e6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,"SPV_NV_stereo_view_rendering",&local_7e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,"SPV_NV_sample_mask_override_coverage",&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,"SPV_NV_geometry_shader_passthrough",&local_7e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,"SPV_AMD_texture_gather_bias_lod",&local_7ea);
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"SPV_KHR_storage_buffer_storage_class",&local_7eb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,"SPV_KHR_variable_pointers",&local_7ec);
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"SPV_AMD_gpu_shader_int16",&local_7ed);
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,"SPV_KHR_post_depth_coverage",&local_7ee);
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"SPV_KHR_shader_atomic_counter_ops",&local_7ef);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,"SPV_EXT_shader_stencil_export",&local_7f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"SPV_EXT_shader_viewport_index_layer",&local_7f1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,"SPV_AMD_shader_image_load_store_lod",&local_7f2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"SPV_AMD_shader_fragment_mask",&local_7f3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,"SPV_EXT_fragment_fully_covered",&local_7f4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"SPV_AMD_gpu_shader_half_float_fetch",&local_7f5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"SPV_GOOGLE_decorate_string",&local_7f6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"SPV_GOOGLE_hlsl_functionality1",&local_7f7);
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"SPV_GOOGLE_user_type",&local_7f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"SPV_NV_shader_subgroup_partitioned",&local_7f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,"SPV_EXT_demote_to_helper_invocation",&local_7fa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"SPV_EXT_descriptor_indexing",&local_7fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"SPV_NV_fragment_shader_barycentric",&local_7fc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"SPV_NV_compute_shader_derivatives",&local_7fd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"SPV_NV_shader_image_footprint",&local_7fe);
  std::__cxx11::string::string<std::allocator<char>>(local_318,"SPV_NV_shading_rate",&local_7ff);
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"SPV_NV_mesh_shader",&local_800);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"SPV_EXT_mesh_shader",&local_801);
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"SPV_NV_ray_tracing",&local_802);
  std::__cxx11::string::string<std::allocator<char>>(local_298,"SPV_KHR_ray_tracing",&local_803);
  std::__cxx11::string::string<std::allocator<char>>(local_278,"SPV_KHR_ray_query",&local_804);
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"SPV_EXT_fragment_invocation_density",&local_805);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"SPV_EXT_physical_storage_buffer",&local_806);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"SPV_KHR_physical_storage_buffer",&local_807);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"SPV_KHR_terminate_invocation",&local_808);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"SPV_KHR_subgroup_uniform_control_flow",&local_809);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"SPV_KHR_integer_dot_product",&local_80a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"SPV_EXT_shader_image_int64",&local_80b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"SPV_KHR_non_semantic_info",&local_80c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"SPV_KHR_uniform_group_instructions",&local_80d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"SPV_KHR_fragment_shader_barycentric",&local_80e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"SPV_KHR_vulkan_memory_model",&local_80f);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"SPV_NV_bindless_texture",&local_810);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"SPV_EXT_shader_atomic_float_add",&local_811);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"SPV_EXT_fragment_shader_interlock",&local_812);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"SPV_NV_compute_shader_derivatives",&local_813);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"SPV_NV_cooperative_matrix",&local_814);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"SPV_KHR_cooperative_matrix",&local_815);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"SPV_KHR_ray_tracing_position_fetch",&local_816);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<std::__cxx11::string_const*>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->extensions_allowlist_,&local_7d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  lVar1 = 0x7a0;
  do {
    std::__cxx11::string::_M_dispose();
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void LocalSingleBlockLoadStoreElimPass::InitExtensions() {
  extensions_allowlist_.clear();
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_GOOGLE_user_type",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_demote_to_helper_invocation",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch"});
}